

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_sub>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  
  iVar6 = a->h * a->w * a->d * a->elempack;
  uVar9 = 0;
  uVar7 = (ulong)(uint)a->c;
  if (a->c < 1) {
    uVar7 = uVar9;
  }
  for (; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    lVar10 = b->elemsize * b->cstep * uVar9;
    pvVar1 = b->data;
    lVar12 = c->elemsize * c->cstep * uVar9;
    pvVar2 = c->data;
    lVar11 = a->elemsize * a->cstep * uVar9;
    pvVar3 = a->data;
    lVar8 = 0;
    lVar13 = 0;
    for (iVar14 = 0; iVar14 + 7 < iVar6; iVar14 = iVar14 + 8) {
      auVar5 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar3 + lVar13 + lVar11),
                          *(undefined1 (*) [32])((long)pvVar1 + lVar13 + lVar10));
      *(undefined1 (*) [32])((long)pvVar2 + lVar13 + lVar12) = auVar5;
      lVar13 = lVar13 + 0x20;
      lVar8 = lVar8 + 8;
    }
    for (; iVar14 + 3 < iVar6; iVar14 = iVar14 + 4) {
      auVar4 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar3 + lVar13 + lVar11),
                          *(undefined1 (*) [16])((long)pvVar1 + lVar13 + lVar10));
      *(undefined1 (*) [16])((long)pvVar2 + lVar13 + lVar12) = auVar4;
      lVar13 = lVar13 + 0x10;
      lVar8 = lVar8 + 4;
    }
    for (; (int)lVar8 < iVar6; lVar8 = lVar8 + 1) {
      *(float *)((long)pvVar2 + lVar8 * 4 + lVar12) =
           *(float *)((long)pvVar3 + lVar8 * 4 + lVar11) -
           *(float *)((long)pvVar1 + lVar8 * 4 + lVar10);
    }
  }
  return iVar6;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}